

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O3

int __thiscall QtMWidgets::ScrollerPrivate::init(ScrollerPrivate *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  QVariantAnimation *this_00;
  
  uVar1 = FingerGeometry::height();
  uVar2 = FingerGeometry::width();
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  this->minVelocity = uVar2 * 3;
  this->maxVelocity = uVar2 * 2;
  this->startDragDistance = uVar2;
  QObject::installEventFilter(this->target);
  this_00 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(this_00,&this->q->super_QObject);
  this->scrollAnimation = this_00;
  QVariantAnimation::setEasingCurve((QEasingCurve *)this_00);
  iVar3 = QVariantAnimation::setDuration((int)this->scrollAnimation);
  return iVar3;
}

Assistant:

void
ScrollerPrivate::init()
{
	const int finger = qMax( FingerGeometry::height(), FingerGeometry::width() );

	minVelocity = finger * 3;
	maxVelocity = finger * 2;
	startDragDistance = finger;

	target->installEventFilter( q );

	scrollAnimation = new QVariantAnimation( q );
	scrollAnimation->setEasingCurve( scrollingCurve );
	scrollAnimation->setDuration( scrollTime );
}